

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-double-page-size.cc
# Opt level: O2

void doubleBoxSize(QPDFPageObjectHelper *page,char *box_name)

{
  char cVar1;
  bool bVar2;
  runtime_error *this;
  double dVar3;
  vector local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  char *local_d0;
  iterator __begin1;
  QPDFObjectHandle box;
  iterator __end1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> doubled;
  QPDFObjectHandle local_40;
  
  local_d0 = box_name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin1,box_name,(allocator<char> *)&__end1);
  QPDFPageObjectHelper::getAttribute((string *)&box,SUB81(page,0));
  std::__cxx11::string::~string((string *)&__begin1);
  cVar1 = QPDFObjectHandle::isNull();
  if (cVar1 == '\0') {
    cVar1 = QPDFObjectHandle::isRectangle();
    if (cVar1 == '\0') {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&doubled,"box ",(allocator<char> *)local_e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&doubled,
                     local_d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                     " is not an array of four elements");
      std::runtime_error::runtime_error(this,(string *)&__begin1);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    doubled.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    doubled.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    doubled.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QPDFObjectHandle::aitems();
    QPDFObjectHandle::QPDFArrayItems::begin();
    QPDFObjectHandle::QPDFArrayItems::end();
    while( true ) {
      bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=(&__begin1,&__end1);
      if (!bVar2) break;
      QPDFObjectHandle::QPDFArrayItems::iterator::operator*(&__begin1);
      dVar3 = (double)QPDFObjectHandle::getNumericValue();
      QPDFObjectHandle::newReal(dVar3 + dVar3,(int)&local_40,true);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
      emplace_back<QPDFObjectHandle>(&doubled,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::QPDFArrayItems::iterator::operator++(&__begin1);
    }
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&__end1);
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&__begin1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&__end1,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(page + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin1,local_d0,(allocator<char> *)&local_40);
    QPDFObjectHandle::newArray(local_e0);
    QPDFObjectHandle::replaceKey((string *)&__end1,(QPDFObjectHandle *)&__begin1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
    std::__cxx11::string::~string((string *)&__begin1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end1.m);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&doubled);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&box.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
doubleBoxSize(QPDFPageObjectHelper& page, char const* box_name)
{
    // We need to use getAttribute rather than getKey as some boxes could be inherited.
    auto box = page.getAttribute(box_name, true);
    if (box.isNull()) {
        return;
    }
    if (!box.isRectangle()) {
        throw std::runtime_error(
            std::string("box ") + box_name + " is not an array of four elements");
    }
    std::vector<QPDFObjectHandle> doubled;
    for (auto& item: box.aitems()) {
        doubled.push_back(QPDFObjectHandle::newReal(item.getNumericValue() * 2.0, 2));
    }
    page.getObjectHandle().replaceKey(box_name, QPDFObjectHandle::newArray(doubled));
}